

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MDLImporter::SizeCheck(MDLImporter *this,void *szPos,char *szFile,uint iLine)

{
  char *pcVar1;
  runtime_error *this_00;
  size_t sVar2;
  char szBuffer [1024];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  char local_428 [1032];
  
  if (szFile == (char *)0x0) {
    __assert_fail("__null != szFile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x108,
                  "void Assimp::MDLImporter::SizeCheck(const void *, const char *, unsigned int)");
  }
  if ((szPos != (void *)0x0) && (szPos <= this->mBuffer + this->iFileSize)) {
    return;
  }
  pcVar1 = strrchr(szFile,0x5c);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strrchr(szFile,0x2f);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = szFile;
    }
  }
  sprintf(local_428,
          "Invalid MDL file. The file is too small or contains invalid data (File: %s Line: %u)",
          pcVar1 + 1,(ulong)iLine);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_448[0] = local_438;
  sVar2 = strlen(local_428);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,local_428,local_428 + sVar2);
  std::runtime_error::runtime_error(this_00,(string *)local_448);
  *(undefined ***)this_00 = &PTR__runtime_error_007fc4b8;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MDLImporter::SizeCheck(const void* szPos, const char* szFile, unsigned int iLine)
{
    ai_assert(NULL != szFile);
    if (!szPos || (const unsigned char*)szPos > mBuffer + iFileSize)
    {
        // remove a directory if there is one
        const char* szFilePtr = ::strrchr(szFile,'\\');
        if (!szFilePtr) {
            if(!(szFilePtr = ::strrchr(szFile,'/')))
                szFilePtr = szFile;
        }
        if (szFilePtr)++szFilePtr;

        char szBuffer[1024];
        ::sprintf(szBuffer,"Invalid MDL file. The file is too small "
            "or contains invalid data (File: %s Line: %u)",szFilePtr,iLine);

        throw DeadlyImportError(szBuffer);
    }
}